

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall sqvector<SQOuterVar>::~sqvector(sqvector<SQOuterVar> *this)

{
  SQOuterVar *pSVar1;
  SQUnsignedInteger SVar2;
  long lVar3;
  ulong uVar4;
  
  SVar2 = this->_allocated;
  if (SVar2 != 0) {
    if (this->_size != 0) {
      lVar3 = 0x18;
      uVar4 = 0;
      do {
        pSVar1 = this->_vals;
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)&pSVar1->_type + lVar3));
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)pSVar1 + lVar3 + -0x10));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x28;
      } while (uVar4 < this->_size);
      SVar2 = this->_allocated;
    }
    sq_vm_free(this->_vals,SVar2 * 0x28);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }